

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Light.cpp
# Opt level: O1

void __thiscall OpenMD::Perturbations::Light::initialize(Light *this)

{
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *this_00;
  undefined8 *puVar1;
  pointer pdVar2;
  bool bVar3;
  LightParameters *pLVar4;
  pointer pcVar5;
  uint i;
  long lVar6;
  mapped_type *pmVar7;
  _Base_ptr p_Var8;
  iterator iVar9;
  pointer pcVar10;
  byte bVar11;
  undefined8 unaff_RBP;
  undefined8 uVar12;
  byte bVar13;
  byte bVar14;
  double tmp;
  undefined4 uVar15;
  undefined4 uVar16;
  double dVar17;
  double tmp_1;
  double dVar18;
  vector<double,_std::allocator<double>_> k;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>_>_>
  stringToPolarization;
  undefined1 local_d8 [80];
  double local_88;
  long *local_80 [2];
  long local_70 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>_>_>
  local_60;
  
  if ((this->lightParams->WaveVector).super_ParameterBase.empty_ == false) {
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_d8,
               &(this->lightParams->WaveVector).data_);
    (this->k_).super_Vector<double,_3U>.data_[0] = *(double *)local_d8._0_8_;
    (this->k_).super_Vector<double,_3U>.data_[1] = *(double *)(local_d8._0_8_ + 8);
    (this->k_).super_Vector<double,_3U>.data_[2] = *(double *)(local_d8._0_8_ + 0x10);
    dVar17 = 0.0;
    lVar6 = 0;
    do {
      dVar18 = (this->k_).super_Vector<double,_3U>.data_[lVar6];
      dVar17 = dVar17 + dVar18 * dVar18;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    if (dVar17 < 0.0) {
      dVar17 = sqrt(dVar17);
    }
    else {
      dVar17 = SQRT(dVar17);
    }
    dVar18 = 0.0;
    this->kmag_ = dVar17;
    this->lambda_ = 6.283185307179586 / dVar17;
    this->omega_ = 18836.515673088536 / (6.283185307179586 / dVar17);
    dVar17 = (this->k_).super_Vector<double,_3U>.data_[1];
    (this->khat_).super_Vector<double,_3U>.data_[0] = (this->k_).super_Vector<double,_3U>.data_[0];
    (this->khat_).super_Vector<double,_3U>.data_[1] = dVar17;
    (this->khat_).super_Vector<double,_3U>.data_[2] = (this->k_).super_Vector<double,_3U>.data_[2];
    lVar6 = 0;
    do {
      dVar17 = (this->khat_).super_Vector<double,_3U>.data_[lVar6];
      dVar18 = dVar18 + dVar17 * dVar17;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    if (dVar18 < 0.0) {
      dVar18 = sqrt(dVar18);
    }
    else {
      dVar18 = SQRT(dVar18);
    }
    lVar6 = 0;
    do {
      (this->khat_).super_Vector<double,_3U>.data_[lVar6] =
           (this->khat_).super_Vector<double,_3U>.data_[lVar6] / dVar18;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    if ((double *)local_d8._0_8_ != (double *)0x0) {
      operator_delete((void *)local_d8._0_8_,local_d8._16_8_ - local_d8._0_8_);
    }
    uVar12 = CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
  }
  else {
    uVar12 = 0;
  }
  bVar14 = (byte)uVar12;
  bVar13 = bVar14;
  if ((this->lightParams->PropagationDirection).super_ParameterBase.empty_ == false) {
    if (bVar14 != 0) {
      memcpy(&painCave,
             "light: please specify either waveVector or propagationDirection, but not both.\n",0x50
            );
      painCave.isFatal = 1;
      simError();
    }
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_d8,
               &(this->lightParams->PropagationDirection).data_);
    (this->khat_).super_Vector<double,_3U>.data_[0] = *(double *)local_d8._0_8_;
    (this->khat_).super_Vector<double,_3U>.data_[1] = *(double *)(local_d8._0_8_ + 8);
    (this->khat_).super_Vector<double,_3U>.data_[2] = *(double *)(local_d8._0_8_ + 0x10);
    dVar17 = 0.0;
    lVar6 = 0;
    do {
      dVar18 = (this->khat_).super_Vector<double,_3U>.data_[lVar6];
      dVar17 = dVar17 + dVar18 * dVar18;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    if (dVar17 < 0.0) {
      dVar17 = sqrt(dVar17);
    }
    else {
      dVar17 = SQRT(dVar17);
    }
    lVar6 = 0;
    do {
      (this->khat_).super_Vector<double,_3U>.data_[lVar6] =
           (this->khat_).super_Vector<double,_3U>.data_[lVar6] / dVar17;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    if ((double *)local_d8._0_8_ != (double *)0x0) {
      operator_delete((void *)local_d8._0_8_,local_d8._16_8_ - local_d8._0_8_);
    }
    bVar13 = 1;
  }
  if ((this->lightParams->Wavelength).super_ParameterBase.empty_ == false) {
    if (bVar14 != 0) {
      memcpy(&painCave,
             "light: please specify one of: waveVector, wavelength, orfrequency (but only one of these).\n"
             ,0x5c);
      painCave.isFatal = 1;
      simError();
    }
    dVar17 = (this->lightParams->Wavelength).data_ * 10.0;
    this->lambda_ = dVar17;
    this->omega_ = 18836.515673088536 / dVar17;
    this->kmag_ = 6.283185307179586 / dVar17;
    uVar12 = CONCAT71((int7)((ulong)uVar12 >> 8),1);
  }
  uVar15 = (undefined4)uVar12;
  if ((this->lightParams->Frequency).super_ParameterBase.empty_ == false) {
    if ((char)uVar12 != '\0') {
      memcpy(&painCave,
             "light: please specify one of: waveVector, wavelength, orfrequency (but only one of these).\n"
             ,0x5c);
      painCave.isFatal = 1;
      simError();
    }
    dVar17 = (this->lightParams->Frequency).data_ * 1e-15;
    this->omega_ = dVar17;
    dVar17 = 18836.515673088536 / dVar17;
    this->lambda_ = dVar17;
    this->kmag_ = 6.283185307179586 / dVar17;
    uVar15 = (undefined4)CONCAT71((int7)((ulong)uVar12 >> 8),1);
  }
  if (((char)uVar15 != '\0') && (bVar13 != 0)) {
    dVar17 = this->kmag_;
    local_d8._0_8_ = (double *)0x0;
    local_d8._8_8_ = (pointer)0x0;
    local_d8._16_8_ = (pointer)0x0;
    lVar6 = 0;
    do {
      *(double *)(local_d8 + lVar6 * 8) =
           (this->khat_).super_Vector<double,_3U>.data_[lVar6] * dVar17;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    (this->k_).super_Vector<double,_3U>.data_[2] = (double)local_d8._16_8_;
    (this->k_).super_Vector<double,_3U>.data_[0] = (double)local_d8._0_8_;
    (this->k_).super_Vector<double,_3U>.data_[1] = (double)local_d8._8_8_;
  }
  bVar3 = (this->lightParams->Intensity).super_ParameterBase.empty_;
  if (bVar3 == false) {
    dVar17 = (this->lightParams->Intensity).data_ * 1.439326e-11;
    dVar17 = (dVar17 + dVar17) / 0.7184379357665581;
    if (dVar17 < 0.0) {
      dVar17 = sqrt(dVar17);
    }
    else {
      dVar17 = SQRT(dVar17);
    }
    this->E0_ = dVar17;
  }
  this_00 = &this->jones_;
  pcVar10 = (this->jones_).
            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
            .super__Vector_impl_data._M_start;
  if ((this->jones_).
      super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
      super__Vector_impl_data._M_finish != pcVar10) {
    (this->jones_).super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = pcVar10;
  }
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::reserve(this_00,2);
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  pdVar2 = (pointer)(local_d8 + 0x10);
  local_d8._0_8_ = pdVar2;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"X","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>_>_>
                         *)&local_60,(key_type *)local_d8);
  *pmVar7 = lightX;
  if ((pointer)local_d8._0_8_ != pdVar2) {
    operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
  }
  local_d8._0_8_ = pdVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"Y","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>_>_>
                         *)&local_60,(key_type *)local_d8);
  *pmVar7 = lightY;
  if ((pointer)local_d8._0_8_ != pdVar2) {
    operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
  }
  local_d8._0_8_ = pdVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"+","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>_>_>
                         *)&local_60,(key_type *)local_d8);
  *pmVar7 = lightPlus;
  if ((pointer)local_d8._0_8_ != pdVar2) {
    operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
  }
  local_d8._0_8_ = pdVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"-","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>_>_>
                         *)&local_60,(key_type *)local_d8);
  local_88 = (double)CONCAT44(local_88._4_4_,uVar15);
  *pmVar7 = lightMinus;
  if ((pointer)local_d8._0_8_ != pdVar2) {
    operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
  }
  pLVar4 = this->lightParams;
  if ((pLVar4->Polarization).super_ParameterBase.empty_ != false) {
    local_d8._8_8_ = (pointer)0x0;
    local_d8._16_8_ = local_d8._16_8_ & 0xffffffffffffff00;
    local_d8._0_8_ = pdVar2;
    if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
        &local_60._M_impl.super__Rb_tree_header) {
      lVar6 = 0;
      p_Var8 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        local_80[0] = local_70;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_80,*(long *)(p_Var8 + 1),
                   (long)&(p_Var8[1]._M_parent)->_M_color + *(long *)(p_Var8 + 1));
        std::__cxx11::string::append((char *)local_80);
        std::__cxx11::string::_M_append(local_d8,(ulong)local_80[0]);
        if (local_80[0] != local_70) {
          operator_delete(local_80[0],local_70[0] + 1);
        }
        lVar6 = (long)&(p_Var8[1]._M_parent)->_M_color + (long)(int)lVar6 + 2;
        if (0x31 < (int)lVar6) {
          std::__cxx11::string::append(local_d8);
          lVar6 = 0;
        }
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
      } while ((_Rb_tree_header *)p_Var8 != &local_60._M_impl.super__Rb_tree_header);
    }
    std::__cxx11::string::erase((ulong)local_d8,local_d8._8_8_ - 2);
    snprintf(painCave.errMsg,2000,
             "Light: No polarization was set in the omd file. This parameter\n\tmust be set to use Light, and can take any of these values:\n\t\t%s.\n"
             ,local_d8._0_8_);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
    bVar14 = local_88._0_1_;
    if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
      operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
    }
    bVar11 = 0;
    goto LAB_0023caae;
  }
  pcVar5 = (pLVar4->Polarization).data_._M_dataplus._M_p;
  local_d8._0_8_ = pdVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_d8,pcVar5,pcVar5 + (pLVar4->Polarization).data_._M_string_length);
  iVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>_>_>
          ::find(&local_60,(key_type *)local_d8);
  bVar14 = SUB81(local_88,0);
  switch(iVar9._M_node[2]._M_color) {
  case _S_red:
    pcVar10 = (this_00->
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)pcVar10->_M_value = 0x3ff0000000000000;
    *(undefined8 *)(pcVar10->_M_value + 8) = 0;
    pcVar10 = (this_00->
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)pcVar10[1]._M_value = 0;
    *(undefined8 *)(pcVar10[1]._M_value + 8) = 0;
    goto LAB_0023ca8f;
  case _S_black:
    pcVar10 = (this_00->
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)pcVar10->_M_value = 0;
    *(undefined8 *)(pcVar10->_M_value + 8) = 0;
    pcVar10 = (this_00->
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    uVar15 = 0x3ff00000;
    uVar16 = 0;
    break;
  case 2:
    pcVar10 = (this_00->
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)pcVar10->_M_value = 0x3ff0000000000000;
    *(undefined8 *)(pcVar10->_M_value + 8) = 0;
    pcVar10 = (this_00->
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    uVar15 = 0;
    uVar16 = 0x3ff00000;
    break;
  case 3:
    pcVar10 = (this_00->
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)pcVar10->_M_value = 0x3ff0000000000000;
    *(undefined8 *)(pcVar10->_M_value + 8) = 0;
    pcVar10 = (this_00->
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    uVar15 = 0;
    uVar16 = 0xbff00000;
    break;
  default:
    builtin_strncpy(painCave.errMsg + 0x10,"olarization type\n",0x12);
    builtin_strncpy(painCave.errMsg,"Light: Unknown p",0x10);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
    bVar11 = 0;
    goto LAB_0023ca92;
  }
  *(undefined4 *)pcVar10[1]._M_value = 0;
  *(undefined4 *)(pcVar10[1]._M_value + 4) = uVar15;
  *(undefined4 *)(pcVar10[1]._M_value + 8) = 0;
  *(undefined4 *)(pcVar10[1]._M_value + 0xc) = uVar16;
LAB_0023ca8f:
  bVar11 = 1;
LAB_0023ca92:
  if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
    operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
  }
LAB_0023caae:
  if ((bVar14 & bVar13 & ~bVar3 & bVar11) == 1) {
    this->doLight = true;
  }
  else {
    if (bVar13 == 0) {
      builtin_strncpy(painCave.errMsg,"Light: could not determine direction of propagation.\n",0x36)
      ;
      painCave.isFatal = 1;
      simError();
    }
    if (bVar3 != false) {
      builtin_strncpy(painCave.errMsg + 0x10," not specified.\n",0x11);
      builtin_strncpy(painCave.errMsg,"Light: intensity",0x10);
      painCave.isFatal = 1;
      simError();
    }
    if (bVar14 == 0) {
      builtin_strncpy(painCave.errMsg,"Light: could not determine frequency or wavelength.\n",0x35);
      painCave.isFatal = 1;
      simError();
    }
    if (bVar11 == 0) {
      builtin_strncpy(painCave.errMsg,"Light: polarization  not specifieid.\n",0x26);
      painCave.isFatal = 1;
      simError();
    }
  }
  if ((this->info_->sman_->atomStorageLayout_ & 0x40) != 0) {
    this->doParticlePot = true;
  }
  dVar17 = (this->khat_).super_Vector<double,_3U>.data_[2];
  uVar15 = SUB84(dVar17,0);
  uVar16 = (undefined4)((ulong)dVar17 >> 0x20);
  if (dVar17 <= -1.0) {
    uVar15 = 0;
    uVar16 = 0xbff00000;
  }
  if (1.0 <= (double)CONCAT44(uVar16,uVar15)) {
    uVar15 = 0;
    uVar16 = 0x3ff00000;
  }
  local_88 = acos((double)CONCAT44(uVar16,uVar15));
  dVar17 = atan2(-(this->khat_).super_Vector<double,_3U>.data_[1],
                 (this->khat_).super_Vector<double,_3U>.data_[0]);
  SquareMatrix3<double>::setupRotMat
            (&this->A_,
             (double)(~-(ulong)(dVar17 < 0.0) & (ulong)dVar17 |
                     (ulong)(dVar17 + 6.283185307179586) & -(ulong)(dVar17 < 0.0)),local_88,0.0);
  SquareMatrix3<double>::inverse((SquareMatrix3<double> *)local_d8,&this->A_);
  if (&this->Ainv_ != (SquareMatrix3<double> *)local_d8) {
    lVar6 = 0;
    do {
      *(undefined8 *)
       ((long)(this->Ainv_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
       + lVar6 + 0x10) = *(undefined8 *)(local_d8 + lVar6 + 0x10);
      uVar12 = *(undefined8 *)(local_d8 + lVar6 + 8);
      puVar1 = (undefined8 *)
               ((long)(this->Ainv_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                      data_[0] + lVar6);
      *puVar1 = *(undefined8 *)(local_d8 + lVar6);
      puVar1[1] = uVar12;
      lVar6 = lVar6 + 0x18;
    } while (lVar6 != 0x48);
  }
  this->initialized = true;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void Light::initialize() {
    bool haveE0           = false;
    bool haveDirection    = false;
    bool haveFrequency    = false;
    bool havePolarization = false;

    if (lightParams->haveWaveVector()) {
      std::vector<RealType> k = lightParams->getWaveVector();
      // wave vectors are input in inverse angstroms, so no unit conversion:
      k_.x()        = k[0];
      k_.y()        = k[1];
      k_.z()        = k[2];
      kmag_         = k_.length();
      lambda_       = 2.0 * Constants::PI / kmag_;
      omega_        = 2.0 * Constants::PI * Constants::c / lambda_;
      haveFrequency = true;
      khat_         = k_;
      khat_.normalize();
      haveDirection = true;
    }

    if (lightParams->havePropagationDirection()) {
      if (haveDirection) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "light: please specify either waveVector or "
                 "propagationDirection, but not both.\n");
        painCave.isFatal = 1;
        simError();
      }
      std::vector<RealType> pd = lightParams->getPropagationDirection();
      khat_.x()                = pd[0];
      khat_.y()                = pd[1];
      khat_.z()                = pd[2];
      khat_.normalize();
      haveDirection = true;
    }

    if (lightParams->haveWavelength()) {
      if (haveFrequency) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "light: please specify one of: waveVector, wavelength, or"
                 "frequency (but only one of these).\n");
        painCave.isFatal = 1;
        simError();
      }
      // wavelengths are entered in nm to work with experimentalists.
      // Convert to angstroms:
      lambda_       = lightParams->getWavelength() * 10.0;
      omega_        = 2.0 * Constants::PI * Constants::c / lambda_;
      kmag_         = 2.0 * Constants::PI / lambda_;
      haveFrequency = true;
    }

    if (lightParams->haveFrequency()) {
      if (haveFrequency) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "light: please specify one of: waveVector, wavelength, or"
                 "frequency (but only one of these).\n");
        painCave.isFatal = 1;
        simError();
      }
      // frequencies are entered in Hz to work with experimentalists.
      // Convert to fs^-1
      omega_        = lightParams->getFrequency() * 1.0e-15;
      lambda_       = 2.0 * Constants::PI * Constants::c / omega_;
      kmag_         = 2.0 * Constants::PI / lambda_;
      haveFrequency = true;
    }

    if (haveFrequency && haveDirection) { k_ = khat_ * kmag_; }

    if (lightParams->haveIntensity()) {
      RealType intense = lightParams->getIntensity();
      // intensities are input in W/cm^2
      intense *= 1.439326e-11;
      E0_ = std::sqrt(2.0 * intense / (Constants::epsilon0 * Constants::c));
      // E0 now has units of kcal/mol e^-1 Angstroms^-1
      haveE0 = true;
    }

    // Determine Polarization Type
    jones_.clear();
    jones_.reserve(2);
    std::map<std::string, LightPolarization> stringToPolarization;

    stringToPolarization["X"] = lightX;
    stringToPolarization["Y"] = lightY;
    stringToPolarization["+"] = lightPlus;
    stringToPolarization["-"] = lightMinus;

    if (lightParams->havePolarization()) {
      std::string lpl      = lightParams->getPolarization();
      LightPolarization lp = stringToPolarization.find(lpl)->second;
      switch (lp) {
      case lightX:
        jones_[0]        = {1.0, 0.0};
        jones_[1]        = {0.0, 0.0};
        havePolarization = true;
        break;
      case lightY:
        jones_[0]        = {0.0, 0.0};
        jones_[1]        = {1.0, 0.0};
        havePolarization = true;
        break;
      case lightPlus:
        jones_[0]        = {1.0, 0.0};
        jones_[1]        = {0.0, 1.0};
        havePolarization = true;
        break;
      case lightMinus:
        jones_[0]        = {1.0, 0.0};
        jones_[1]        = {0.0, -1.0};
        havePolarization = true;
        break;
      default:
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Light: Unknown polarization type\n");
        painCave.isFatal  = 1;
        painCave.severity = OPENMD_ERROR;
        simError();
        break;
      }

    } else {
      std::string allowedPolarizations;
      int currentLineLength = 0;

      for (std::map<std::string, LightPolarization>::iterator polStrIter =
               stringToPolarization.begin();
           polStrIter != stringToPolarization.end(); ++polStrIter) {
        allowedPolarizations += polStrIter->first + ", ";
        currentLineLength += polStrIter->first.length() + 2;

        if (currentLineLength >= 50) {
          allowedPolarizations += "\n\t\t";
          currentLineLength = 0;
        }
      }

      allowedPolarizations.erase(allowedPolarizations.length() - 2, 2);

      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "Light: No polarization was set in the omd file. This parameter\n"
          "\tmust be set to use Light, and can take any of these values:\n"
          "\t\t%s.\n",
          allowedPolarizations.c_str());
      painCave.isFatal  = 1;
      painCave.severity = OPENMD_ERROR;
      simError();
    }

    if (haveE0 && haveDirection && haveFrequency && havePolarization) {
      doLight = true;
    } else {
      if (!haveDirection) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Light: could not determine direction of propagation.\n");
        painCave.isFatal = 1;
        simError();
      }
      if (!haveE0) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Light: intensity not specified.\n");
        painCave.isFatal = 1;
        simError();
      }
      if (!haveFrequency) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Light: could not determine frequency or wavelength.\n");
        painCave.isFatal = 1;
        simError();
      }
      if (!havePolarization) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Light: polarization  not specifieid.\n");
        painCave.isFatal = 1;
        simError();
      }
    }

    int storageLayout_ = info_->getSnapshotManager()->getAtomStorageLayout();
    if (storageLayout_ & DataStorage::dslParticlePot) doParticlePot = true;

    // Relatively simple Euler angles between khat_ and lab frame:

    RealType psi = 0.0;
    RealType theta =
        acos(std::min((RealType)1.0, std::max((RealType)-1.0, khat_[2])));
    RealType phi = std::atan2(-khat_[1], khat_[0]);

    if (phi < 0) phi += 2.0 * Constants::PI;

    A_.setupRotMat(phi, theta, psi);
    Ainv_ = A_.inverse();

    initialized = true;
  }